

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

bool __thiscall
brotli::HashLongestMatchQuickly<17,_4,_true>::FindLongestMatch
          (HashLongestMatchQuickly<17,_4,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  int *piVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  uint8_t uVar5;
  ulong uVar6;
  int iVar7;
  uint8_t *puVar8;
  size_t sVar9;
  uint8_t *puVar10;
  uint32_t *puVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  long local_70;
  int *local_60;
  
  uVar12 = *best_len_out;
  piVar1 = (int *)(ring_buffer + (cur_ix & ring_buffer_mask));
  lVar4 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar5 = *(uint8_t *)(uVar12 + (long)piVar1);
  dVar23 = *best_score_out;
  iVar3 = *distance_cache;
  uVar16 = cur_ix - (long)iVar3;
  iVar7 = 0;
  if ((uVar16 < cur_ix) &&
     (uVar15 = (uint)uVar16 & (uint)ring_buffer_mask, uVar5 == ring_buffer[uVar12 + uVar15])) {
    if (7 < max_length) {
      uVar14 = max_length & 0xfffffffffffffff8;
      local_60 = (int *)((long)piVar1 + uVar14);
      local_70 = 0;
      uVar16 = 0;
LAB_001204b3:
      if (*(ulong *)(piVar1 + uVar16 * 2) == *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar15))
      goto code_r0x001204c0;
      uVar14 = *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar15) ^
               *(ulong *)(piVar1 + uVar16 * 2);
      uVar16 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      uVar16 = (uVar16 >> 3 & 0x1fffffff) - local_70;
      goto LAB_001204fa;
    }
    uVar14 = 0;
    local_60 = piVar1;
LAB_001208ad:
    uVar22 = max_length & 7;
    uVar16 = uVar14;
    if (uVar22 != 0) {
      uVar20 = uVar14 | uVar22;
      do {
        uVar16 = uVar14;
        if (ring_buffer[uVar14 + uVar15] != (uint8_t)*local_60) break;
        local_60 = (int *)((long)local_60 + 1);
        uVar14 = uVar14 + 1;
        uVar22 = uVar22 - 1;
        uVar16 = uVar20;
      } while (uVar22 != 0);
    }
LAB_001204fa:
    if (3 < uVar16) {
      auVar24._8_4_ = (int)(uVar16 >> 0x20);
      auVar24._0_8_ = uVar16;
      auVar24._12_4_ = 0x45300000;
      dVar23 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 + 0.6;
      *best_len_out = uVar16;
      *best_len_code_out = uVar16;
      *best_distance_out = (long)iVar3;
      *best_score_out = dVar23;
      uVar5 = *(uint8_t *)((long)piVar1 + uVar16);
      bVar21 = true;
      uVar12 = uVar16;
      goto LAB_0012056c;
    }
  }
  bVar21 = false;
LAB_0012056c:
  puVar11 = this->buckets_ + ((ulong)(lVar4 * 0x1e35a7bd000000) >> 0x2f);
  uVar16 = (ulong)((uint)max_length & 7);
  do {
    uVar15 = *puVar11;
    uVar13 = uVar15 & (uint)ring_buffer_mask;
    if (((uVar5 == ring_buffer[uVar12 + uVar13]) && (cur_ix != uVar15)) &&
       (uVar14 = cur_ix - uVar15, uVar14 <= max_backward)) {
      if (7 < max_length) {
        lVar18 = 0;
        uVar22 = 0;
LAB_00120605:
        if (*(ulong *)(piVar1 + uVar22 * 2) == *(ulong *)(ring_buffer + uVar22 * 8 + (ulong)uVar13))
        goto code_r0x00120612;
        uVar20 = *(ulong *)(ring_buffer + uVar22 * 8 + (ulong)uVar13) ^
                 *(ulong *)(piVar1 + uVar22 * 2);
        uVar22 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar22 = (uVar22 >> 3 & 0x1fffffff) - lVar18;
        goto LAB_0012063c;
      }
      uVar20 = 0;
      piVar19 = piVar1;
LAB_001206bf:
      uVar22 = uVar20;
      if (uVar16 != 0) {
        uVar6 = uVar20 | uVar16;
        uVar17 = uVar16;
        do {
          uVar22 = uVar20;
          if (ring_buffer[uVar20 + uVar13] != (uint8_t)*piVar19) break;
          piVar19 = (int *)((long)piVar19 + 1);
          uVar20 = uVar20 + 1;
          uVar17 = uVar17 - 1;
          uVar22 = uVar6;
        } while (uVar17 != 0);
      }
LAB_0012063c:
      if (3 < uVar22) {
        auVar27._8_4_ = (int)(uVar22 >> 0x20);
        auVar27._0_8_ = uVar22;
        auVar27._12_4_ = 0x45300000;
        iVar3 = 0x1f;
        if ((uint)uVar14 != 0) {
          for (; (uint)uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        dVar26 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0)) * 5.4 +
                 (double)iVar3 * -1.2;
        if (dVar23 < dVar26) {
          *best_len_out = uVar22;
          *best_len_code_out = uVar22;
          *best_distance_out = uVar14;
          *best_score_out = dVar26;
          uVar5 = *(uint8_t *)((long)piVar1 + uVar22);
          bVar21 = true;
          uVar12 = uVar22;
          dVar23 = dVar26;
        }
      }
    }
    puVar11 = puVar11 + 1;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  if (!bVar21) {
    if (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_) {
      this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
      uVar2 = *(ushort *)(kStaticDictionaryHash + (ulong)((uint)(*piVar1 * 0x1e35a7bd) >> 0x12) * 4)
      ;
      if (uVar2 != 0) {
        uVar15 = uVar2 & 0x1f;
        uVar12 = (ulong)uVar15;
        if (uVar12 <= max_length) {
          puVar8 = kBrotliDictionary +
                   (uVar15 * (uVar2 >> 5) + kBrotliDictionaryOffsetsByLength[uVar12]);
          if (7 < uVar15) {
            uVar14 = (ulong)(uVar2 & 0x18);
            puVar10 = puVar8 + uVar14;
            uVar16 = 0;
LAB_001207af:
            if (*(ulong *)(puVar8 + uVar16) == *(ulong *)((long)piVar1 + uVar16))
            goto code_r0x001207bc;
            uVar22 = *(ulong *)((long)piVar1 + uVar16) ^ *(ulong *)(puVar8 + uVar16);
            uVar14 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar16 = (uVar14 >> 3 & 0x1fffffff) + uVar16;
            goto LAB_001207db;
          }
          uVar14 = 0;
          puVar10 = puVar8;
LAB_001208e8:
          uVar22 = uVar12 & 7;
          uVar16 = uVar14;
          if ((uVar2 & 7) != 0) {
            uVar20 = uVar14 | uVar22;
            do {
              uVar16 = uVar14;
              if (*(uint8_t *)((long)piVar1 + uVar14) != *puVar10) break;
              puVar10 = puVar10 + 1;
              uVar14 = uVar14 + 1;
              uVar22 = uVar22 - 1;
              uVar16 = uVar20;
            } while (uVar22 != 0);
          }
LAB_001207db:
          if ((uVar16 != 0) && (uVar12 < uVar16 + 10)) {
            sVar9 = (long)(1 << (""[uVar12] & 0x1f)) *
                    (ulong)(byte)kCutoffTransforms[uVar12 - uVar16] + max_backward + (uVar2 >> 5) +
                    1;
            auVar25._8_4_ = (int)(uVar16 >> 0x20);
            auVar25._0_8_ = uVar16;
            auVar25._12_4_ = 0x45300000;
            iVar3 = 0x1f;
            uVar15 = (uint)sVar9;
            if (uVar15 != 0) {
              for (; uVar15 >> iVar3 == 0; iVar3 = iVar3 + -1) {
              }
            }
            dVar26 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 +
                     (double)iVar3 * -1.2;
            if (dVar23 < dVar26) {
              this->num_dict_matches_ = this->num_dict_matches_ + 1;
              *best_len_out = uVar16;
              *best_len_code_out = uVar12;
              *best_distance_out = sVar9;
              *best_score_out = dVar26;
              bVar21 = true;
            }
          }
        }
      }
    }
  }
  this->buckets_[(uint)((ulong)(lVar4 * 0x1e35a7bd000000) >> 0x2f) + ((uint)(cur_ix >> 3) & 3)] =
       (uint32_t)cur_ix;
  return bVar21;
code_r0x001204c0:
  uVar16 = uVar16 + 1;
  local_70 = local_70 + -8;
  if (max_length >> 3 == uVar16) goto LAB_001208ad;
  goto LAB_001204b3;
code_r0x00120612:
  uVar22 = uVar22 + 1;
  lVar18 = lVar18 + -8;
  uVar20 = max_length & 0xfffffffffffffff8;
  piVar19 = (int *)((max_length & 0xfffffffffffffff8) + (long)piVar1);
  if (max_length >> 3 == uVar22) goto LAB_001206bf;
  goto LAB_00120605;
code_r0x001207bc:
  uVar16 = uVar16 + 8;
  if (uVar14 == uVar16) goto LAB_001208e8;
  goto LAB_001207af;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }